

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O0

vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *
vk::enumerateInstanceLayerProperties
          (vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
           *__return_storage_ptr__,PlatformInterface *vkp)

{
  PlatformInterface *pPVar1;
  VkResult VVar2;
  deBool dVar3;
  reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  TestError *this;
  uint local_20;
  undefined1 local_19;
  deUint32 numLayers;
  PlatformInterface *vkp_local;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *properties;
  
  local_19 = 0;
  _numLayers = vkp;
  vkp_local = (PlatformInterface *)__return_storage_ptr__;
  std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::vector
            (__return_storage_ptr__);
  local_20 = 0;
  VVar2 = (*_numLayers->_vptr_PlatformInterface[3])(_numLayers,&local_20,0);
  checkResult(VVar2,"vkp.enumerateInstanceLayerProperties(&numLayers, DE_NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
              ,0xb1);
  if (local_20 != 0) {
    std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::resize
              (__return_storage_ptr__,(ulong)local_20);
    pPVar1 = _numLayers;
    pvVar4 = std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::operator[]
                       (__return_storage_ptr__,0);
    VVar2 = (*pPVar1->_vptr_PlatformInterface[3])(pPVar1,&local_20,pvVar4);
    checkResult(VVar2,"vkp.enumerateInstanceLayerProperties(&numLayers, &properties[0])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                ,0xb6);
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) ||
         (uVar5 = (ulong)local_20,
         sVar6 = std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::size
                           (__return_storage_ptr__), uVar5 != sVar6)) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,(char *)0x0,"(size_t)numLayers == properties.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                   ,0xb7);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkLayerProperties> enumerateInstanceLayerProperties (const PlatformInterface& vkp)
{
	vector<VkLayerProperties>	properties;
	deUint32					numLayers	= 0;

	VK_CHECK(vkp.enumerateInstanceLayerProperties(&numLayers, DE_NULL));

	if (numLayers > 0)
	{
		properties.resize(numLayers);
		VK_CHECK(vkp.enumerateInstanceLayerProperties(&numLayers, &properties[0]));
		TCU_CHECK((size_t)numLayers == properties.size());
	}

	return properties;
}